

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__inotify_read(uv_loop_t *loop,uv__io_t *dummy,uint events)

{
  uint uVar1;
  int *__s;
  uv__queue *puVar2;
  ssize_t sVar3;
  watcher_list *w;
  char *pcVar4;
  int *piVar5;
  int *piVar6;
  uv__queue queue;
  char buf [4096];
  
  while( true ) {
    while( true ) {
      sVar3 = read(loop->inotify_fd,buf,0x1000);
      if (sVar3 != -1) break;
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        if (*piVar5 == 0xb) {
          return;
        }
        __assert_fail("errno == EAGAIN || errno == EWOULDBLOCK",
                      "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                      ,0x945,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
      }
    }
    if (sVar3 < 1) break;
    for (piVar5 = (int *)buf; piVar5 < buf + sVar3;
        piVar5 = (int *)((long)piVar5 + (ulong)(uint)piVar5[3] + 0x10)) {
      uVar1 = piVar5[1];
      w = find_watcher(loop,*piVar5);
      if (w != (watcher_list *)0x0) {
        if (piVar5[3] == 0) {
          __s = (int *)w->path;
          pcVar4 = strrchr((char *)__s,0x2f);
          piVar6 = (int *)(pcVar4 + 1);
          if (pcVar4 == (char *)0x0) {
            piVar6 = __s;
          }
        }
        else {
          piVar6 = piVar5 + 4;
        }
        w->iterating = 1;
        uv__queue_move(&w->watchers,&queue);
        while (queue.next != &queue) {
          puVar2 = (queue.next)->next;
          (queue.next)->prev->next = puVar2;
          puVar2->prev = (queue.next)->prev;
          (queue.next)->next = &w->watchers;
          puVar2 = (w->watchers).prev;
          (queue.next)->prev = puVar2;
          puVar2->next = queue.next;
          (w->watchers).prev = queue.next;
          (*(code *)queue.next[-1].prev)
                    (queue.next + -7,piVar6,
                     ((uVar1 & 0xfffffff9) != 0) + ((uVar1 & 6) != 0) * '\x02',0);
        }
        w->iterating = 0;
        maybe_free_watcher_list(w,loop);
      }
    }
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                ,0x949,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
}

Assistant:

static void uv__inotify_read(uv_loop_t* loop,
                             uv__io_t* dummy,
                             unsigned int events) {
  const struct inotify_event* e;
  struct watcher_list* w;
  uv_fs_event_t* h;
  struct uv__queue queue;
  struct uv__queue* q;
  const char* path;
  ssize_t size;
  const char *p;
  /* needs to be large enough for sizeof(inotify_event) + strlen(path) */
  char buf[4096];

  for (;;) {
    do
      size = read(loop->inotify_fd, buf, sizeof(buf));
    while (size == -1 && errno == EINTR);

    if (size == -1) {
      assert(errno == EAGAIN || errno == EWOULDBLOCK);
      break;
    }

    assert(size > 0); /* pre-2.6.21 thing, size=0 == read buffer too small */

    /* Now we have one or more inotify_event structs. */
    for (p = buf; p < buf + size; p += sizeof(*e) + e->len) {
      e = (const struct inotify_event*) p;

      events = 0;
      if (e->mask & (IN_ATTRIB|IN_MODIFY))
        events |= UV_CHANGE;
      if (e->mask & ~(IN_ATTRIB|IN_MODIFY))
        events |= UV_RENAME;

      w = find_watcher(loop, e->wd);
      if (w == NULL)
        continue; /* Stale event, no watchers left. */

      /* inotify does not return the filename when monitoring a single file
       * for modifications. Repurpose the filename for API compatibility.
       * I'm not convinced this is a good thing, maybe it should go.
       */
      path = e->len ? (const char*) (e + 1) : uv__basename_r(w->path);

      /* We're about to iterate over the queue and call user's callbacks.
       * What can go wrong?
       * A callback could call uv_fs_event_stop()
       * and the queue can change under our feet.
       * So, we use uv__queue_move() trick to safely iterate over the queue.
       * And we don't free the watcher_list until we're done iterating.
       *
       * First,
       * tell uv_fs_event_stop() (that could be called from a user's callback)
       * not to free watcher_list.
       */
      w->iterating = 1;
      uv__queue_move(&w->watchers, &queue);
      while (!uv__queue_empty(&queue)) {
        q = uv__queue_head(&queue);
        h = uv__queue_data(q, uv_fs_event_t, watchers);

        uv__queue_remove(q);
        uv__queue_insert_tail(&w->watchers, q);

        h->cb(h, path, events, 0);
      }
      /* done iterating, time to (maybe) free empty watcher_list */
      w->iterating = 0;
      maybe_free_watcher_list(w, loop);
    }
  }
}